

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwGetInputMode(GLFWwindow *handle,int mode)

{
  uint in_ESI;
  long in_RDI;
  _GLFWwindow *window;
  int local_4;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_4 = 0;
  }
  else {
    switch(in_ESI) {
    case 0x33001:
      local_4 = *(int *)(in_RDI + 0x7c);
      break;
    case 0x33002:
      local_4 = *(int *)(in_RDI + 0x70);
      break;
    case 0x33003:
      local_4 = *(int *)(in_RDI + 0x74);
      break;
    case 0x33004:
      local_4 = *(int *)(in_RDI + 0x78);
      break;
    case 0x33005:
      local_4 = *(int *)(in_RDI + 0x1f8);
      break;
    default:
      _glfwInputError(0x10003,"Invalid input mode 0x%08X",(ulong)in_ESI);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

GLFWAPI int glfwGetInputMode(GLFWwindow* handle, int mode)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (mode)
    {
        case GLFW_CURSOR:
            return window->cursorMode;
        case GLFW_STICKY_KEYS:
            return window->stickyKeys;
        case GLFW_STICKY_MOUSE_BUTTONS:
            return window->stickyMouseButtons;
        case GLFW_LOCK_KEY_MODS:
            return window->lockKeyMods;
        case GLFW_RAW_MOUSE_MOTION:
            return window->rawMouseMotion;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
    return 0;
}